

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O1

int I422Copy(uint8_t *src_y,int src_stride_y,uint8_t *src_u,int src_stride_u,uint8_t *src_v,
            int src_stride_v,uint8_t *dst_y,int dst_stride_y,uint8_t *dst_u,int dst_stride_u,
            uint8_t *dst_v,int dst_stride_v,int width,int height)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  
  auVar4._0_4_ = -(uint)(src_u == (uint8_t *)0x0);
  auVar4._4_4_ = -(uint)(src_v == (uint8_t *)0x0);
  auVar4._8_4_ = -(uint)(dst_u == (uint8_t *)0x0);
  auVar4._12_4_ = -(uint)(dst_v == (uint8_t *)0x0);
  iVar2 = movmskps((int)src_u,auVar4);
  iVar1 = -1;
  if ((height != 0 && 0 < width) && iVar2 == 0) {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      uVar3 = ~height;
      src_y = src_y + (int)(uVar3 * src_stride_y);
      src_u = src_u + (int)(uVar3 * src_stride_u);
      src_v = src_v + (int)(uVar3 * src_stride_v);
      src_stride_y = -src_stride_y;
      src_stride_u = -src_stride_u;
      src_stride_v = -src_stride_v;
    }
    iVar2 = width + 1 >> 1;
    if (dst_y != (uint8_t *)0x0) {
      CopyPlane(src_y,src_stride_y,dst_y,dst_stride_y,width,iVar1);
    }
    CopyPlane(src_u,src_stride_u,dst_u,dst_stride_u,iVar2,iVar1);
    CopyPlane(src_v,src_stride_v,dst_v,dst_stride_v,iVar2,iVar1);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int I422Copy(const uint8_t* src_y,
             int src_stride_y,
             const uint8_t* src_u,
             int src_stride_u,
             const uint8_t* src_v,
             int src_stride_v,
             uint8_t* dst_y,
             int dst_stride_y,
             uint8_t* dst_u,
             int dst_stride_u,
             uint8_t* dst_v,
             int dst_stride_v,
             int width,
             int height) {
  int halfwidth = (width + 1) >> 1;
  if (!src_u || !src_v || !dst_u || !dst_v || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_y = src_y + (height - 1) * src_stride_y;
    src_u = src_u + (height - 1) * src_stride_u;
    src_v = src_v + (height - 1) * src_stride_v;
    src_stride_y = -src_stride_y;
    src_stride_u = -src_stride_u;
    src_stride_v = -src_stride_v;
  }

  if (dst_y) {
    CopyPlane(src_y, src_stride_y, dst_y, dst_stride_y, width, height);
  }
  CopyPlane(src_u, src_stride_u, dst_u, dst_stride_u, halfwidth, height);
  CopyPlane(src_v, src_stride_v, dst_v, dst_stride_v, halfwidth, height);
  return 0;
}